

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestSuite::~TestSuite(TestSuite *this)

{
  pointer ppTVar1;
  TestInfo *this_00;
  pointer piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer ppTVar5;
  
  this->_vptr_TestSuite = (_func_int **)&PTR__TestSuite_00197098;
  ppTVar1 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar5 = (this->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1; ppTVar5 = ppTVar5 + 1
      ) {
    this_00 = *ppTVar5;
    if (this_00 != (TestInfo *)0x0) {
      TestInfo::~TestInfo(this_00);
    }
    operator_delete(this_00,0x110);
  }
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::~vector
            (&(this->ad_hoc_test_result_).test_properties_);
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
            (&(this->ad_hoc_test_result_).test_part_results_);
  internal::Mutex::~Mutex(&(this->ad_hoc_test_result_).test_properties_mutex_);
  piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  ppTVar5 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar5 != (pointer)0x0) {
    operator_delete(ppTVar5,(long)(this->test_info_list_).
                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar5
                   );
  }
  __ptr = (this->type_param_)._M_t.
          super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  if (__ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->type_param_,__ptr);
  }
  (this->type_param_)._M_t.
  super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar3 = (this->name_)._M_dataplus._M_p;
  paVar4 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TestSuite::~TestSuite() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}